

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int advance(dwarf_buf *buf,size_t count)

{
  ulong uVar1;
  char local_f8 [8];
  char b [200];
  
  uVar1 = buf->left;
  if (uVar1 < count) {
    if (buf->reported_underflow == 0) {
      snprintf(local_f8,200,"%s in %s at %d","DWARF underflow",buf->name,
               (ulong)(uint)(*(int *)&buf->buf - *(int *)&buf->start));
      (*buf->error_callback)(buf->data,local_f8,0);
      buf->reported_underflow = 1;
    }
    if (uVar1 < count) {
      return 0;
    }
  }
  buf->buf = buf->buf + count;
  buf->left = buf->left - count;
  return 1;
}

Assistant:

static int
advance (struct dwarf_buf *buf, size_t count)
{
  if (!require (buf, count))
    return 0;
  buf->buf += count;
  buf->left -= count;
  return 1;
}